

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall Lexer::mustGetAnyOf(Lexer *this,List<Token> *toks)

{
  ulong uVar1;
  Token TVar2;
  _Elt_pointer pTVar3;
  _Map_pointer ppTVar4;
  _Map_pointer ppTVar5;
  Token *pTVar6;
  TokenInfo *tok;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Token *pTVar10;
  long lVar11;
  ulong uVar12;
  _Map_pointer ppTVar13;
  _Elt_pointer pTVar14;
  Token *pTVar15;
  List<Token> *__range1;
  _Elt_pointer pTVar16;
  Token *pTVar17;
  String toknames;
  bool local_a2;
  bool local_a1;
  _Map_pointer local_a0;
  String local_98;
  _Elt_pointer local_78;
  String local_70;
  String local_50;
  
  bVar8 = next(this,Any);
  if (!bVar8) {
    error<>("unexpected EOF");
  }
  pTVar16 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_78 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  bVar8 = pTVar16 == local_78;
  if (!bVar8) {
    pTVar14 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    local_a0 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      TVar2 = *pTVar16;
      pTVar3 = (this->m_tokenPosition)._M_cur;
      ppTVar4 = (this->m_tokenPosition)._M_node;
      ppTVar5 = (this->m_tokens)._deque.
                super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      bVar9 = ppTVar4 < ppTVar5;
      if (ppTVar4 == ppTVar5) {
        bVar9 = pTVar3 < (this->m_tokens)._deque.
                         super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      if (bVar9) {
        ppTVar5 = (this->m_tokens)._deque.
                  super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
        bVar7 = ppTVar5 <= ppTVar4;
        if (ppTVar4 == ppTVar5) {
          bVar7 = (this->m_tokens)._deque.
                  super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur <= pTVar3;
        }
        if (!bVar7) goto LAB_0011eb41;
      }
      else {
LAB_0011eb41:
        if (bVar9) {
          ppTVar5 = (this->m_tokens)._deque.
                    super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node;
          bVar9 = ppTVar5 <= ppTVar4;
          if (ppTVar4 == ppTVar5) {
            bVar9 = (this->m_tokens)._deque.
                    super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur <= pTVar3;
          }
        }
        else {
          bVar9 = false;
        }
        local_98._string._M_dataplus._M_p._0_1_ = bVar9;
        local_70._string._M_dataplus._M_p._0_1_ = 1;
        error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                         ,(bool *)&local_98,(bool *)&local_70);
      }
      if (((this->m_tokenPosition)._M_cur)->type == TVar2) {
        if (!bVar8) {
          return;
        }
        break;
      }
      pTVar16 = pTVar16 + 1;
      if (pTVar16 == pTVar14) {
        pTVar16 = local_a0[1];
        local_a0 = local_a0 + 1;
        pTVar14 = pTVar16 + 0x80;
      }
      bVar8 = pTVar16 == local_78;
    } while (!bVar8);
  }
  local_98._string._M_dataplus._M_p = (pointer)&local_98._string.field_2;
  local_98._string._M_string_length = 0;
  local_98._string.field_2._M_local_buf[0] = '\0';
  pTVar15 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pTVar6 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pTVar15 != pTVar6) {
    pTVar17 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppTVar13 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      pTVar16 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      lVar11 = (long)pTVar16 -
               (long)(toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first >> 2;
      uVar1 = lVar11 - 1;
      if (uVar1 < 0x80) {
        pTVar10 = pTVar16 + -1;
      }
      else {
        uVar12 = (uVar1 >> 7) + 0xfe00000000000000;
        if (1 < lVar11) {
          uVar12 = uVar1 >> 7;
        }
        pTVar10 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[uVar12] + uVar1 + uVar12 * -0x80;
      }
      if ((pTVar15 == pTVar10) || (*local_98._string._M_dataplus._M_p != '\0')) {
        std::__cxx11::string::append((char *)&local_98);
      }
      DescribeTokenPrivate(&local_50,*pTVar15,(TokenInfo *)0x0);
      std::__cxx11::string::append((char *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._string._M_dataplus._M_p != &local_50._string.field_2) {
        operator_delete(local_50._string._M_dataplus._M_p);
      }
      pTVar15 = pTVar15 + 1;
      if (pTVar15 == pTVar17) {
        pTVar15 = ppTVar13[1];
        ppTVar13 = ppTVar13 + 1;
        pTVar17 = pTVar15 + 0x80;
      }
    } while (pTVar15 != pTVar6);
  }
  pTVar3 = (this->m_tokenPosition)._M_cur;
  ppTVar4 = (this->m_tokenPosition)._M_node;
  ppTVar5 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar8 = ppTVar4 < ppTVar5;
  if (ppTVar4 == ppTVar5) {
    bVar8 = pTVar3 < (this->m_tokens)._deque.
                     super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar8) {
    ppTVar5 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar9 = ppTVar5 <= ppTVar4;
    if (ppTVar4 == ppTVar5) {
      bVar9 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar3;
    }
    if (bVar9) goto LAB_0011ed37;
  }
  if (bVar8) {
    ppTVar5 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    local_a1 = ppTVar5 <= ppTVar4;
    if (ppTVar4 == ppTVar5) {
      local_a1 = (this->m_tokens)._deque.
                 super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur <= pTVar3;
    }
  }
  else {
    local_a1 = false;
  }
  local_a2 = true;
  error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                   ,&local_a1,&local_a2);
LAB_0011ed37:
  tok = (this->m_tokenPosition)._M_cur;
  DescribeTokenPrivate(&local_70,tok->type,tok);
  error<String,String>("expected %1, got %2",&local_98,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_70._string._M_dataplus._M_p._1_7_,local_70._string._M_dataplus._M_p._0_1_)
      != &local_70._string.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_70._string._M_dataplus._M_p._1_7_,
                             local_70._string._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._string._M_dataplus._M_p != &local_98._string.field_2) {
    operator_delete(local_98._string._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Lexer::mustGetAnyOf (const List<Token>& toks)
{
	if (!next())
		error ("unexpected EOF");

	for (Token tok : toks)
		if (tokenType() == tok)
			return;

	String toknames;

	for (const Token& tokType : toks)
	{
		if (&tokType == &toks.last())
			toknames += " or ";
		elif (toknames.isEmpty() == false)
			toknames += ", ";

		toknames += DescribeTokenType (tokType);
	}

	error ("expected %1, got %2", toknames, DescribeToken (token()));
}